

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

UniValue * GetServicesNames(UniValue *__return_storage_ptr__,ServiceFlags services)

{
  string str;
  UniValue val;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff68 [56];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  str._M_string_length = (size_type)in_stack_ffffffffffffff50;
  str._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff48;
  str.field_2 = in_stack_ffffffffffffff58;
  UniValue::UniValue(__return_storage_ptr__,VARR,str);
  std::__cxx11::string::~string((string *)&local_48);
  serviceFlagsToStr_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffff48,services);
  pbVar1 = in_stack_ffffffffffffff48;
  pbVar2 = in_stack_ffffffffffffff50;
  for (; in_stack_ffffffffffffff48 != in_stack_ffffffffffffff50;
      in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 + 1) {
    UniValue::
    UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)&stack0xffffffffffffff60,in_stack_ffffffffffffff48);
    val.val._M_dataplus._M_p = (pointer)pbVar2;
    val._0_8_ = pbVar1;
    val.val._8_16_ = in_stack_ffffffffffffff58;
    val._32_56_ = in_stack_ffffffffffffff68;
    UniValue::push_back(__return_storage_ptr__,val);
    UniValue::~UniValue((UniValue *)&stack0xffffffffffffff60);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue GetServicesNames(ServiceFlags services)
{
    UniValue servicesNames(UniValue::VARR);

    for (const auto& flag : serviceFlagsToStr(services)) {
        servicesNames.push_back(flag);
    }

    return servicesNames;
}